

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utext.cpp
# Opt level: O1

int64_t ucstrTextLength(UText *ut)

{
  long lVar1;
  long lVar2;
  
  if (ut->a < 0) {
    lVar2 = ut->chunkNativeLimit;
    if (*(short *)((long)ut->context + lVar2 * 2) != 0) {
      do {
        lVar1 = lVar2 * 2;
        lVar2 = lVar2 + 1;
      } while (*(short *)((long)ut->context + lVar1 + 2) != 0);
      ut->chunkNativeLimit = lVar2;
    }
    ut->a = lVar2;
    ut->chunkLength = (int32_t)lVar2;
    ut->nativeIndexingLimit = (int32_t)lVar2;
    *(byte *)&ut->providerProperties = (byte)ut->providerProperties & 0xfd;
  }
  return ut->a;
}

Assistant:

static int64_t U_CALLCONV
ucstrTextLength(UText *ut) {
    if (ut->a < 0) {
        // null terminated, we don't yet know the length.  Scan for it.
        //    Access is not convenient for doing this
        //    because the current interation postion can't be changed.
        const UChar  *str = (const UChar *)ut->context;
        for (;;) {
            if (str[ut->chunkNativeLimit] == 0) {
                break;
            }
            ut->chunkNativeLimit++;
        }
        ut->a = ut->chunkNativeLimit;
        ut->chunkLength = (int32_t)ut->chunkNativeLimit;
        ut->nativeIndexingLimit = ut->chunkLength;
        ut->providerProperties &= ~I32_FLAG(UTEXT_PROVIDER_LENGTH_IS_EXPENSIVE);
    }
    return ut->a;
}